

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

null_terminating_iterator<wchar_t> __thiscall
fmt::v5::internal::
parse_arg_id<fmt::v5::internal::null_terminating_iterator<wchar_t>,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>&,wchar_t>>
          (internal *this,null_terminating_iterator<wchar_t> it,
          id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
          *handler)

{
  uint uVar1;
  long lVar2;
  wchar_t *pwVar3;
  uint id;
  internal *piVar4;
  internal *piVar5;
  internal *piVar6;
  basic_string_view<wchar_t> name;
  null_terminating_iterator<wchar_t> nVar7;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_1
  local_48;
  undefined4 local_38;
  
  pwVar3 = it.end_;
  piVar4 = (internal *)it.ptr_;
  if (this == piVar4) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(uint *)this;
    if ((uVar1 == 0x7d) || (uVar1 == 0x3a)) {
      lVar2 = *(long *)pwVar3;
      basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>
      ::next_arg((format_arg *)&local_48.string,
                 (basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>
                  *)(lVar2 + 8));
      *(undefined4 *)(lVar2 + 0x60) = local_38;
      *(longlong *)(lVar2 + 0x50) = local_48.long_long_value;
      *(size_t *)(lVar2 + 0x58) = local_48.string.size;
      piVar6 = this;
      goto LAB_001204ef;
    }
    if (uVar1 - 0x30 < 10) {
      id = 0;
      piVar5 = this + 4;
      do {
        piVar6 = piVar5;
        if (0xccccccc < id) goto LAB_00120507;
        id = (uVar1 + id * 10) - 0x30;
        if (piVar6 == piVar4) {
          if ((int)id < 0) goto LAB_00120507;
          goto LAB_00120513;
        }
        uVar1 = *(uint *)piVar6;
        piVar5 = piVar6 + 4;
      } while (uVar1 - 0x30 < 10);
      if ((int)id < 0) {
LAB_00120507:
        error_handler::on_error((error_handler *)this,"number is too big");
      }
      if ((uVar1 == 0x3a) || (uVar1 == 0x7d)) {
        format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
        ::on_arg_id(*(format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                      **)pwVar3,id);
        goto LAB_001204ef;
      }
      goto LAB_00120513;
    }
  }
  if ((uVar1 != 0x5f) && (0x19 < (uVar1 & 0xffffffdf) - 0x41)) {
LAB_00120513:
    error_handler::on_error((error_handler *)this,"invalid format string");
  }
  lVar2 = 0;
  piVar5 = this + 4;
  do {
    piVar6 = piVar5;
    uVar1 = 0;
    if (piVar6 != piVar4) {
      uVar1 = *(uint *)piVar6;
    }
    piVar5 = piVar6 + 4;
    lVar2 = lVar2 + 4;
  } while (((uVar1 - 0x30 < 10) || (uVar1 == 0x5f)) || ((uVar1 & 0xffffffdf) - 0x41 < 0x1a));
  name.size_ = lVar2 >> 2;
  lVar2 = *(long *)pwVar3;
  name.data_ = (wchar_t *)this;
  basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>
  ::get_arg((format_arg *)&local_48.string,
            (basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>
             *)(lVar2 + 8),name);
  *(undefined4 *)(lVar2 + 0x60) = local_38;
  *(longlong *)(lVar2 + 0x50) = local_48.long_long_value;
  *(size_t *)(lVar2 + 0x58) = local_48.string.size;
LAB_001204ef:
  nVar7.end_ = (wchar_t *)piVar4;
  nVar7.ptr_ = (wchar_t *)piVar6;
  return nVar7;
}

Assistant:

FMT_CONSTEXPR Iterator parse_arg_id(Iterator it, IDHandler &&handler) {
  typedef typename std::iterator_traits<Iterator>::value_type char_type;
  char_type c = *it;
  if (c == '}' || c == ':') {
    handler();
    return it;
  }
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(it, handler);
    if (*it != '}' && *it != ':') {
      handler.on_error("invalid format string");
      return it;
    }
    handler(index);
    return it;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return it;
  }
  auto start = it;
  do {
    c = *++it;
  } while (is_name_start(c) || ('0' <= c && c <= '9'));
  handler(basic_string_view<char_type>(pointer_from(start), to_unsigned(it - start)));
  return it;
}